

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  long ****pppplVar2;
  long ***ppplVar3;
  __pid_t _Var4;
  int *piVar5;
  uint uVar6;
  long ****pppplVar7;
  void **ppvVar8;
  int status;
  QUEUE pending;
  int local_3c;
  long ***local_38;
  long ***local_30;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                  ,0x3b,"void uv__chld(uv_signal_t *, int)");
  }
  pppplVar7 = (long ****)handle->loop->process_handles[0];
  ppvVar8 = handle->loop->process_handles;
  if (pppplVar7 != (long ****)ppvVar8) {
    local_38 = (long ***)&local_38;
    local_30 = (long ***)&local_38;
    do {
      pppplVar2 = (long ****)*pppplVar7;
      do {
        _Var4 = waitpid(*(__pid_t *)(pppplVar7 + -1),&local_3c,1);
        if (_Var4 != -1) {
          if (_Var4 != 0) {
            *(int *)(pppplVar7 + 2) = local_3c;
            ppplVar3 = *pppplVar7;
            *pppplVar7[1] = (long **)ppplVar3;
            ppplVar3[1] = (long **)pppplVar7[1];
            *pppplVar7 = (long ***)&local_38;
            pppplVar7[1] = local_30;
            *local_30 = (long **)pppplVar7;
            local_30 = (long ***)pppplVar7;
          }
          goto LAB_001581f5;
        }
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      if (*piVar5 != 10) {
        abort();
      }
LAB_001581f5:
      pppplVar7 = pppplVar2;
    } while (pppplVar2 != (long ****)ppvVar8);
    pppplVar7 = (long ****)local_38;
    if ((long ****)local_38 != &local_38) {
      do {
        pppplVar2 = (long ****)*pppplVar7;
        *pppplVar7[1] = (long **)pppplVar2;
        pppplVar2[1] = pppplVar7[1];
        *pppplVar7 = (long ***)pppplVar7;
        pppplVar7[1] = (long ***)pppplVar7;
        uVar1 = *(uint *)(pppplVar7 + -3);
        if (((uVar1 >> 0xe & 1) != 0) &&
           (*(uint *)(pppplVar7 + -3) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
          *(int *)(pppplVar7[-0xd] + 1) = *(int *)(pppplVar7[-0xd] + 1) + -1;
        }
        if (pppplVar7[-2] != (long ***)0x0) {
          uVar6 = *(uint *)(pppplVar7 + 2) & 0x7f;
          uVar1 = *(uint *)(pppplVar7 + 2) >> 8 & 0xff;
          if (uVar6 != 0) {
            uVar1 = 0;
          }
          if ((int)(uVar6 * 0x1000000 + 0x1000000) < 0x2000000) {
            uVar6 = 0;
          }
          (*(code *)pppplVar7[-2])(pppplVar7 + -0xe,uVar1,uVar6);
        }
        pppplVar7 = pppplVar2;
      } while (pppplVar2 != &local_38);
      if (&local_38 != (long ****)local_38) {
        __assert_fail("QUEUE_EMPTY(&pending)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                      ,0x6f,"void uv__chld(uv_signal_t *, int)");
      }
    }
  }
  return;
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    do
      pid = waitpid(process->pid, &status, WNOHANG);
    while (pid == -1 && errno == EINTR);

    if (pid == 0)
      continue;

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      continue;
    }

    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}